

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binning.cpp
# Opt level: O2

double duckdb::RoundToNumber(double input,double num,NiceRounding rounding)

{
  bool bVar1;
  double dVar2;
  
  if (rounding == ROUND) {
    dVar2 = round(input / num);
  }
  else {
    dVar2 = ceil(input / num);
  }
  bVar1 = Value::IsFinite<double>(dVar2 * num);
  dVar2 = dVar2 * num;
  if (!bVar1) {
    dVar2 = input;
  }
  return dVar2;
}

Assistant:

double RoundToNumber(double input, double num, NiceRounding rounding) {
	double result;
	if (rounding == NiceRounding::ROUND) {
		result = std::round(input / num) * num;
	} else {
		result = std::ceil(input / num) * num;
	}
	if (!Value::IsFinite(result)) {
		return input;
	}
	return result;
}